

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void Expect(istream *input,char c)

{
  char __rhs;
  ReadException *this;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __rhs = std::istream::get();
  if ((int)__rhs == (int)CONCAT71(in_register_00000031,c)) {
    return;
  }
  this = (ReadException *)__cxa_allocate_exception(0x28);
  s_abi_cxx11_(&local_60,"unexpected char: expected ",0x1a);
  std::operator+(&local_80,&local_60,c);
  s_abi_cxx11_(&local_40,", got ",6);
  std::operator+(&local_a0,&local_80,&local_40);
  std::operator+(&local_c0,&local_a0,__rhs);
  ReadException::ReadException(this,&local_c0);
  __cxa_throw(this,&ReadException::typeinfo,ReadException::~ReadException);
}

Assistant:

static void Expect(std::istream &input, char c) {
  char read = (char)input.get();
  if (read != c) {
    throw ReadException("unexpected char: expected "s + c + ", got "s + read);
  }
}